

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::ctx::ctx(ctx *this,env *environment_,text *proposition_)

{
  env *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  text *in_stack_ffffffffffffff98;
  string local_38 [56];
  
  *in_RDI = in_RSI;
  *(undefined1 *)(in_RDI + 1) = 1;
  std::__cxx11::string::string(local_38,(string *)in_RDX);
  env::push(in_RDX,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

ctx( env & environment_, text proposition_ )
    : environment( environment_), once( true )
    {
        environment.push( proposition_);
    }